

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

int js_os_init(JSContext *ctx,JSModuleDef *m)

{
  int iVar1;
  JSRuntime *pJVar2;
  void *pvVar3;
  JSValue JVar4;
  JSValue func_obj;
  
  os_poll_func = js_os_poll;
  JS_NewClassID(&js_os_timer_class_id);
  pJVar2 = JS_GetRuntime(ctx);
  JS_NewClass(pJVar2,js_os_timer_class_id,&js_os_timer_class);
  pJVar2 = JS_GetRuntime(ctx);
  pvVar3 = JS_GetRuntimeOpaque(pJVar2);
  JS_NewClassID(&js_worker_class_id);
  pJVar2 = JS_GetRuntime(ctx);
  JS_NewClass(pJVar2,js_worker_class_id,&js_worker_class);
  JVar4 = JS_NewObject(ctx);
  JS_SetPropertyFunctionList(ctx,JVar4,js_worker_proto_funcs,2);
  func_obj = JS_NewCFunction2(ctx,js_worker_ctor,"Worker",1,JS_CFUNC_constructor,0);
  JS_SetConstructor(ctx,func_obj,JVar4);
  JS_SetClassProto(ctx,js_worker_class_id,JVar4);
  if ((*(JSWorkerMessagePipe **)((long)pvVar3 + 0x48) != (JSWorkerMessagePipe *)0x0) &&
     (*(JSWorkerMessagePipe **)((long)pvVar3 + 0x50) != (JSWorkerMessagePipe *)0x0)) {
    JVar4 = js_worker_ctor_internal
                      (ctx,(JSValue)(ZEXT816(3) << 0x40),
                       *(JSWorkerMessagePipe **)((long)pvVar3 + 0x48),
                       *(JSWorkerMessagePipe **)((long)pvVar3 + 0x50));
    JS_DefinePropertyValueStr(ctx,func_obj,"parent",JVar4,7);
  }
  JS_SetModuleExport(ctx,m,"Worker",func_obj);
  iVar1 = JS_SetModuleExportList(ctx,m,js_os_funcs,0x44);
  return iVar1;
}

Assistant:

static int js_os_init(JSContext *ctx, JSModuleDef *m)
{
    os_poll_func = js_os_poll;
    
    /* OSTimer class */
    JS_NewClassID(&js_os_timer_class_id);
    JS_NewClass(JS_GetRuntime(ctx), js_os_timer_class_id, &js_os_timer_class);

#ifdef USE_WORKER
    {
        JSRuntime *rt = JS_GetRuntime(ctx);
        JSThreadState *ts = JS_GetRuntimeOpaque(rt);
        JSValue proto, obj;
        /* Worker class */
        JS_NewClassID(&js_worker_class_id);
        JS_NewClass(JS_GetRuntime(ctx), js_worker_class_id, &js_worker_class);
        proto = JS_NewObject(ctx);
        JS_SetPropertyFunctionList(ctx, proto, js_worker_proto_funcs, countof(js_worker_proto_funcs));
        
        obj = JS_NewCFunction2(ctx, js_worker_ctor, "Worker", 1,
                               JS_CFUNC_constructor, 0);
        JS_SetConstructor(ctx, obj, proto);
        
        JS_SetClassProto(ctx, js_worker_class_id, proto);
        
        /* set 'Worker.parent' if necessary */
        if (ts->recv_pipe && ts->send_pipe) {
            JS_DefinePropertyValueStr(ctx, obj, "parent",
                                      js_worker_ctor_internal(ctx, JS_UNDEFINED, ts->recv_pipe, ts->send_pipe),
                                      JS_PROP_C_W_E);
        }
        
        JS_SetModuleExport(ctx, m, "Worker", obj);
    }
#endif /* USE_WORKER */

    return JS_SetModuleExportList(ctx, m, js_os_funcs,
                                  countof(js_os_funcs));
}